

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalNinjaGenerator.cxx
# Opt level: O1

vector<cmCustomCommandGenerator,_std::allocator<cmCustomCommandGenerator>_> * __thiscall
cmLocalNinjaGenerator::MakeCustomCommandGenerators
          (vector<cmCustomCommandGenerator,_std::allocator<cmCustomCommandGenerator>_>
           *__return_storage_ptr__,cmLocalNinjaGenerator *this,cmCustomCommand *cc,
          string *fileConfig)

{
  _Rb_tree_header *p_Var1;
  cmGlobalNinjaGenerator *this_00;
  pointer pbVar2;
  _Base_ptr __n;
  bool bVar3;
  PolicyStatus PVar4;
  int iVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar6;
  size_type sVar7;
  _Base_ptr p_Var8;
  string *output;
  pointer pbVar9;
  bool bVar10;
  string *output_1;
  cmCustomCommandGenerator *ccg;
  pointer this_01;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar11;
  bool transformDepfile;
  vector<cmCustomCommandGenerator,_std::allocator<cmCustomCommandGenerator>_> *ccgs;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  allOutputs;
  bool local_a9;
  vector<cmCustomCommandGenerator,std::allocator<cmCustomCommandGenerator>> *local_a8;
  cmLocalNinjaGenerator *local_a0;
  cmGlobalNinjaGenerator *local_98;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_90;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  
  this_00 = (cmGlobalNinjaGenerator *)
            (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator;
  local_a9 = false;
  local_a8 = (vector<cmCustomCommandGenerator,std::allocator<cmCustomCommandGenerator>> *)
             __return_storage_ptr__;
  local_a0 = this;
  PVar4 = cmCustomCommand::GetCMP0116Status(cc);
  if (PVar4 - NEW < 3) {
    local_a9 = true;
  }
  *(undefined8 *)local_a8 = 0;
  *(undefined8 *)(local_a8 + 8) = 0;
  *(undefined8 *)(local_a8 + 0x10) = 0;
  local_90._M_impl._0_8_ = local_a0;
  std::vector<cmCustomCommandGenerator,std::allocator<cmCustomCommandGenerator>>::
  emplace_back<cmCustomCommand_const&,std::__cxx11::string_const&,cmLocalNinjaGenerator*,bool&>
            (local_a8,cc,fileConfig,(cmLocalNinjaGenerator **)&local_90,&local_a9);
  bVar3 = cmGlobalNinjaGenerator::EnableCrossConfigBuild(this_00);
  if (bVar3) {
    pvVar6 = cmCustomCommand::GetOutputs_abi_cxx11_(cc);
    pbVar9 = (pvVar6->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pbVar2 = (pvVar6->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    bVar3 = pbVar9 == pbVar2;
    local_98 = this_00;
    if (bVar3) {
      bVar10 = false;
    }
    else {
      bVar10 = false;
      do {
        sVar7 = cmGeneratorExpression::Find(pbVar9);
        bVar10 = (bool)(bVar10 | sVar7 == 0xffffffffffffffff);
        if (sVar7 == 0xffffffffffffffff) break;
        pbVar9 = pbVar9 + 1;
        bVar3 = pbVar9 == pbVar2;
      } while (!bVar3);
    }
    if (bVar3) {
      pvVar6 = cmCustomCommand::GetByproducts_abi_cxx11_(cc);
      pbVar2 = (pvVar6->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar9 = (pvVar6->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start; bVar3 = pbVar9 != pbVar2, bVar3;
          pbVar9 = pbVar9 + 1) {
        sVar7 = cmGeneratorExpression::Find(pbVar9);
        bVar10 = (bool)(bVar10 | sVar7 == 0xffffffffffffffff);
        if (sVar7 == 0xffffffffffffffff) break;
      }
      if (!bVar3) {
        cmGlobalNinjaGenerator::GetCrossConfigs
                  ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_90,local_98,fileConfig);
        p_Var1 = &local_90._M_impl.super__Rb_tree_header;
        if ((_Rb_tree_header *)local_90._M_impl.super__Rb_tree_header._M_header._M_left != p_Var1) {
          p_Var8 = local_90._M_impl.super__Rb_tree_header._M_header._M_left;
          do {
            __n = (_Base_ptr)fileConfig->_M_string_length;
            if ((__n != p_Var8[1]._M_parent) ||
               ((__n != (_Base_ptr)0x0 &&
                (iVar5 = bcmp((fileConfig->_M_dataplus)._M_p,*(void **)(p_Var8 + 1),(size_t)__n),
                iVar5 != 0)))) {
              local_60._M_impl._0_8_ = local_a0;
              std::vector<cmCustomCommandGenerator,std::allocator<cmCustomCommandGenerator>>::
              emplace_back<cmCustomCommand_const&,std::__cxx11::string_const&,cmLocalNinjaGenerator*,bool&,std::__cxx11::string_const&>
                        (local_a8,cc,fileConfig,(cmLocalNinjaGenerator **)&local_60,&local_a9,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (p_Var8 + 1));
            }
            p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
          } while ((_Rb_tree_header *)p_Var8 != p_Var1);
        }
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~_Rb_tree(&local_90);
        local_90._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_90._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_90._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_60._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_60._M_impl.super__Rb_tree_header._M_header;
        local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
        this_01 = *(pointer *)local_a8;
        local_98 = *(cmGlobalNinjaGenerator **)(local_a8 + 8);
        local_a0 = (cmLocalNinjaGenerator *)
                   CONCAT71(local_a0._1_7_,(cmGlobalNinjaGenerator *)this_01 == local_98);
        local_90._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
        local_90._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
        local_60._M_impl.super__Rb_tree_header._M_header._M_right =
             local_60._M_impl.super__Rb_tree_header._M_header._M_left;
        if ((cmGlobalNinjaGenerator *)this_01 != local_98) {
          do {
            pvVar6 = cmCustomCommandGenerator::GetOutputs_abi_cxx11_(this_01);
            pbVar2 = (pvVar6->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
            for (pbVar9 = (pvVar6->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start; pbVar9 != pbVar2;
                pbVar9 = pbVar9 + 1) {
              pVar11 = std::
                       _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                       ::_M_insert_unique<std::__cxx11::string_const&>
                                 ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                   *)&local_90,pbVar9);
              if (((undefined1  [16])pVar11 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
              goto LAB_002c5cd6;
            }
            pvVar6 = cmCustomCommandGenerator::GetByproducts_abi_cxx11_(this_01);
            pbVar2 = (pvVar6->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
            for (pbVar9 = (pvVar6->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start; bVar3 = pbVar9 != pbVar2,
                bVar3; pbVar9 = pbVar9 + 1) {
              pVar11 = std::
                       _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                       ::_M_insert_unique<std::__cxx11::string_const&>
                                 ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                   *)&local_60,pbVar9);
              if (((undefined1  [16])pVar11 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
                if (bVar3) goto LAB_002c5cd6;
                break;
              }
            }
            this_01 = this_01 + 1;
            local_a0 = (cmLocalNinjaGenerator *)
                       CONCAT71(local_a0._1_7_,(cmGlobalNinjaGenerator *)this_01 == local_98);
          } while ((cmGlobalNinjaGenerator *)this_01 != local_98);
        }
LAB_002c5cd6:
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~_Rb_tree(&local_60);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~_Rb_tree(&local_90);
        if (((ulong)local_a0 & 1) != 0) {
          return (vector<cmCustomCommandGenerator,_std::allocator<cmCustomCommandGenerator>_> *)
                 local_a8;
        }
        std::vector<cmCustomCommandGenerator,_std::allocator<cmCustomCommandGenerator>_>::_M_erase
                  ((vector<cmCustomCommandGenerator,_std::allocator<cmCustomCommandGenerator>_> *)
                   local_a8,(cmCustomCommandGenerator *)(*(long *)local_a8 + 0x160),
                   *(cmCustomCommandGenerator **)(local_a8 + 8));
        return (vector<cmCustomCommandGenerator,_std::allocator<cmCustomCommandGenerator>_> *)
               local_a8;
      }
    }
    if (!bVar10) {
      std::vector<cmCustomCommandGenerator,_std::allocator<cmCustomCommandGenerator>_>::~vector
                ((vector<cmCustomCommandGenerator,_std::allocator<cmCustomCommandGenerator>_> *)
                 local_a8);
    }
  }
  return (vector<cmCustomCommandGenerator,_std::allocator<cmCustomCommandGenerator>_> *)local_a8;
}

Assistant:

std::vector<cmCustomCommandGenerator>
cmLocalNinjaGenerator::MakeCustomCommandGenerators(
  cmCustomCommand const& cc, std::string const& fileConfig)
{
  cmGlobalNinjaGenerator const* gg = this->GetGlobalNinjaGenerator();

  bool transformDepfile = false;
  switch (cc.GetCMP0116Status()) {
    case cmPolicies::WARN:
      CM_FALLTHROUGH;
    case cmPolicies::OLD:
      break;
    case cmPolicies::REQUIRED_IF_USED:
    case cmPolicies::REQUIRED_ALWAYS:
    case cmPolicies::NEW:
      transformDepfile = true;
      break;
  }

  // Start with the build graph's configuration.
  std::vector<cmCustomCommandGenerator> ccgs;
  ccgs.emplace_back(cc, fileConfig, this, transformDepfile);

  // Consider adding cross configurations.
  if (!gg->EnableCrossConfigBuild()) {
    return ccgs;
  }

  // Outputs and byproducts must be expressed using generator expressions.
  for (std::string const& output : cc.GetOutputs()) {
    if (cmGeneratorExpression::Find(output) == std::string::npos) {
      return ccgs;
    }
  }
  for (std::string const& byproduct : cc.GetByproducts()) {
    if (cmGeneratorExpression::Find(byproduct) == std::string::npos) {
      return ccgs;
    }
  }

  // Tentatively add the other cross configurations.
  for (std::string const& config : gg->GetCrossConfigs(fileConfig)) {
    if (fileConfig != config) {
      ccgs.emplace_back(cc, fileConfig, this, transformDepfile, config);
    }
  }

  // If outputs and byproducts are not unique to each configuration,
  // drop the cross configurations.
  if (!HasUniqueOutputs(ccgs)) {
    ccgs.erase(ccgs.begin() + 1, ccgs.end());
  }

  return ccgs;
}